

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

void __thiscall
cmSourceFile::cmSourceFile
          (cmSourceFile *this,cmMakefile *mf,string *name,bool generated,
          cmSourceFileLocationKind kind)

{
  cmSourceFileLocationKind local_54;
  cmSourceFileLocationKind kind_local;
  bool generated_local;
  string *name_local;
  cmMakefile *mf_local;
  cmSourceFile *this_local;
  
  local_54 = kind;
  if (generated) {
    local_54 = Known;
  }
  cmSourceFileLocation::cmSourceFileLocation(&this->Location,mf,name,local_54);
  cmPropertyMap::cmPropertyMap(&this->Properties);
  std::unique_ptr<cmCustomCommand,std::default_delete<cmCustomCommand>>::
  unique_ptr<std::default_delete<cmCustomCommand>,void>
            ((unique_ptr<cmCustomCommand,std::default_delete<cmCustomCommand>> *)
             &this->CustomCommand);
  std::__cxx11::string::string((string *)&this->Extension);
  std::__cxx11::string::string((string *)&this->Language);
  std::__cxx11::string::string((string *)&this->FullPath);
  std::__cxx11::string::string((string *)&this->ObjectLibrary);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Depends);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->CompileOptions);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->CompileDefinitions);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->IncludeDirectories);
  this->FindFullPathFailed = false;
  this->IsGenerated = false;
  if (generated) {
    MarkAsGenerated(this);
  }
  return;
}

Assistant:

cmSourceFile::cmSourceFile(cmMakefile* mf, const std::string& name,
                           bool generated, cmSourceFileLocationKind kind)
  : Location(mf, name, (!generated) ? kind : cmSourceFileLocationKind::Known)
{
  if (generated) {
    this->MarkAsGenerated();
  }
}